

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  ExtensionSet *this_00;
  MessageLite *pMVar1;
  RepeatedPtrFieldBase *this_01;
  Type *pTVar2;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = GetExtensionSet(this,message);
    pMVar1 = ExtensionSet::GetRepeatedMessage(this_00,*(int *)(field + 0x28),index);
    return (Message *)pMVar1;
  }
  this_01 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
  pTVar2 = RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     (this_01,index);
  return pTVar2;
}

Assistant:

const Message& GeneratedMessageReflection::GetRepeatedMessage(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    return GetRaw<RepeatedPtrFieldBase>(message, field)
        .Get<GenericTypeHandler<Message> >(index);
  }
}